

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tree.cpp
# Opt level: O1

int main(void)

{
  pointer pcVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  MatchTable table;
  string integer;
  string digit;
  string id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string number;
  string letter;
  string stra;
  undefined1 local_1a8 [24];
  vector<MatchTool,_std::allocator<MatchTool>_> vStack_190;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110 [2];
  long local_100 [2];
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "(a|b|c|d|e|f|g|h|i|j|k|l|m|n|o|p|q|r|s|t|u|v|w|x|y|z|A|B|C|D|E|F|G|H|I|J|K|L|M|N|O|P|Q|R|S|T|U|V|W|X|Y|Z)"
             ,"");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 "(_|",&local_d0);
  plVar3 = (long *)std::__cxx11::string::append(local_1a8);
  local_130 = &local_120;
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_120 = *plVar4;
    lStack_118 = plVar3[3];
  }
  else {
    local_120 = *plVar4;
    local_130 = (long *)*plVar3;
  }
  local_128 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  pcVar1 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"(1|2|3|4|5|6|7|8|9|0)","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 "(+|-)?",&local_150);
  plVar3 = (long *)std::__cxx11::string::append(local_1a8);
  local_170 = &local_160;
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_160 = *plVar4;
    lStack_158 = plVar3[3];
  }
  else {
    local_160 = *plVar4;
    local_170 = (long *)*plVar3;
  }
  local_168 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_110,local_170,(long)local_170 + local_168);
  std::__cxx11::string::append((char *)local_110);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_110,(ulong)local_150._M_dataplus._M_p);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_80 = *plVar4;
    lStack_78 = plVar3[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar4;
    local_90 = (long *)*plVar3;
  }
  local_88 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar3;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_170);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    local_1a8._16_8_ = *psVar5;
    vStack_190.super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)plVar3[3];
    local_1a8._0_8_ = pcVar1;
  }
  else {
    local_1a8._16_8_ = *psVar5;
    local_1a8._0_8_ = (size_type *)*plVar3;
  }
  local_1a8._8_8_ = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_1a8);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_e0 = *plVar4;
    lStack_d8 = plVar3[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar4;
    local_f0 = (long *)*plVar3;
  }
  local_e8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((pointer)local_1a8._0_8_ != pcVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  vStack_190.super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_190.super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._16_8_ = 0;
  vStack_190.super__Vector_base<MatchTool,_std::allocator<MatchTool>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8._0_8_ = (pointer)0x0;
  local_1a8._8_8_ = (pointer)0x0;
  MatchTable::add((MatchTable *)local_1a8,(char *)local_130);
  MatchTable::add((MatchTable *)local_1a8,(char *)local_170);
  MatchTable::add((MatchTable *)local_1a8,(char *)local_f0);
  MatchTable::generate((MatchTable *)local_1a8);
  iVar2 = MatchTable::match((MatchTable *)local_1a8,"_func");
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  iVar2 = MatchTable::match((MatchTable *)local_1a8,"234");
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  iVar2 = MatchTable::match((MatchTable *)local_1a8,"23.23e12");
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::vector<MatchTool,_std::allocator<MatchTool>_>::~vector(&vStack_190);
  if ((pointer)local_1a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ - local_1a8._0_8_);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main() {
    string letter = "(a|b|c|d|e|f|g|h|i|j|k|l|m|n|o|p|q|r|s|t|u|v|w|x|y|z"
                    "|A|B|C|D|E|F|G|H|I|J|K|L|M|N|O|P|Q|R|S|T|U|V|W|X|Y|Z)";
    string stra = "";
    string id = "(_|" + letter + ")+";
    string digit = "(1|2|3|4|5|6|7|8|9|0)";
    string integer = "(+|-)?" + digit + "+";
    string number = integer + "(\\." + digit + "+)?" + "((e|E)" + integer + "+)?";
    // (+|-)?(1|2|3|4|5|6|7|8|9|0)+(\.(1|2|3|4|5|6|7|8|9|0)+)?((e|E)(+|-)?(1|2|3|4|5|6|7|8|9|0)++)?
//    RegexTree tree1(number.c_str());
//
//    RegexTree::display_node(tree1.getRoot(), cout);
//
//    auto dt = generate_Dtran(tree1);
//
//    cout << endl;
//    for (int i = 0; i < dt.dtran.size(); i++) {
//        cout << i << ". ";
//        cout << "{";
//        for (int j = 0; j < 256; j++) {
//            if (dt.dtran[i][j] != 0) cout << (char)j << ": " << dt.dtran[i][j] << ", ";
//        }
//        cout << "}" << endl;
//    }
//    cout << "targets: ";
//    for (int k : dt.targets) cout << k << " ";
//
//    cout << "\nresult: " << boolalpha << dt.match("-1.234E20") << endl;
    MatchTable table;
    table.add(id.c_str());
    table.add(integer.c_str());
    table.add(number.c_str());
    table.generate();

    cout << table.match("_func") << endl;
    cout << table.match("234") << endl;
    cout << table.match("23.23e12") << endl;

    return 0;
}